

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  
  crnlib_is_debugger_present();
  uVar2 = main_internal(argc,argv);
  crnlib::console::printf("\nExit status: %i",(ulong)uVar2);
  bVar1 = check_for_option(argc,argv,"pause");
  if ((bVar1) && (uVar2 != 0 || crnlib::console::m_num_messages._24_4_ != 0)) {
    crnlib::console::m_output_disabled = 0;
    crnlib::console::message("\nPress a key to continue.");
    do {
      iVar3 = crnlib::crn_getch();
    } while (iVar3 == -1);
  }
  return uVar2;
}

Assistant:

int main(int argc, char* argv[])
{
    int status = EXIT_FAILURE;

    if (crnlib_is_debugger_present())
    {
        status = main_internal(argc, argv);
    }
    else
    {
#ifdef _MSC_VER
        __try
        {
            status = main_internal(argc, argv);
        }
        __except (EXCEPTION_EXECUTE_HANDLER)
        {
            console::error("Uncached exception! crunch command line tool failed!");
        }
#else
        status = main_internal(argc, argv);
#endif
    }

    console::printf("\nExit status: %i", status);

    if (check_for_option(argc, argv, "pause"))
    {
        if ((status == EXIT_FAILURE) || (console::get_num_messages(cErrorConsoleMessage)))
        {
            pause_and_wait();
        }
    }

    return status;
}